

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_RemoveChildren
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  AActor *removetarget;
  AActor *pAVar4;
  AActor *pAVar5;
  char *pcVar6;
  PClassActor *filter;
  bool bVar7;
  TThinkerIterator<AActor> it;
  int local_50;
  FName local_4c;
  FThinkerIterator local_48;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_003e226a;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e223b:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e226a:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x187f,
                  "int AF_AActor_A_RemoveChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar5 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar5 == (AActor *)0x0) goto LAB_003e20ad;
    pPVar3 = (pAVar5->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(pAVar5->super_DThinker).super_DObject._vptr_DObject)(pAVar5);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (pAVar5->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar7 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar7) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar7 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar7) {
      pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e226a;
    }
  }
  else {
    if (pAVar5 != (AActor *)0x0) goto LAB_003e223b;
LAB_003e20ad:
    pAVar5 = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e22ba:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1880,
                    "int AF_AActor_A_RemoveChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    bVar7 = param[1].field_0.i == 0;
LAB_003e2110:
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e22d9:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1881,
                    "int AF_AActor_A_RemoveChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_50 = param[2].field_0.i;
LAB_003e2123:
    if (param[3].field_0.field_3.Type != '\x03') {
LAB_003e2244:
      pcVar6 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003e224b:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1882,
                    "int AF_AActor_A_RemoveChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    filter = (PClassActor *)param[3].field_0.field_1.a;
    if (param[3].field_0.field_1.atag != 1) {
      if (filter != (PClassActor *)0x0) goto LAB_003e2244;
      filter = (PClassActor *)0x0;
    }
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar6 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e22ba;
    }
    bVar7 = param[1].field_0.i == 0;
    if (numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003e2110;
    }
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar6 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e22d9;
    }
    local_50 = param[2].field_0.i;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003e2123;
    }
    if ((param[3].field_0.field_3.Type != '\x03') ||
       (filter = (PClassActor *)param[3].field_0.field_1.a,
       filter != (PClassActor *)0x0 && param[3].field_0.field_1.atag != 1)) {
      pcVar6 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003e224b;
    }
    if (4 < (uint)numparam) {
      if (param[4].field_0.field_3.Type != '\0') {
        pcVar6 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003e2289;
      }
      goto LAB_003e2150;
    }
    param = defaultparam->Array;
  }
  if (param[4].field_0.field_3.Type != '\0') {
    pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e2289:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1883,
                  "int AF_AActor_A_RemoveChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003e2150:
  iVar2 = param[4].field_0.i;
  FThinkerIterator::FThinkerIterator(&local_48,AActor::RegistrationInfo.MyClass,0x80);
  removetarget = (AActor *)FThinkerIterator::Next(&local_48,false);
  if (removetarget != (AActor *)0x0) {
    do {
      pAVar4 = (removetarget->master).field_0.p;
      if (pAVar4 == (AActor *)0x0) {
LAB_003e21a6:
        pAVar4 = (AActor *)0x0;
      }
      else if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
        (removetarget->master).field_0.p = (AActor *)0x0;
        goto LAB_003e21a6;
      }
      if ((pAVar4 == pAVar5) && (!(bool)(0 < removetarget->health & bVar7))) {
        local_4c.Index = iVar2;
        DoRemove(removetarget,local_50,filter,&local_4c);
      }
      removetarget = (AActor *)FThinkerIterator::Next(&local_48,false);
    } while (removetarget != (AActor *)0x0);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RemoveChildren)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_BOOL_DEF(removeall);
	PARAM_INT_DEF(flags);
	PARAM_CLASS_DEF(filter, AActor);
	PARAM_NAME_DEF(species);

	TThinkerIterator<AActor> it;
	AActor *mo;

	while ((mo = it.Next()) != NULL)
	{
		if (mo->master == self && (mo->health <= 0 || removeall))
		{
			DoRemove(mo, flags, filter, species);
		}
	}
	return 0;
}